

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeExtractValues.cpp
# Opt level: O3

void __thiscall TagParser::testCaseResultComplete(TagParser *this,TestCaseResultPtr *caseData)

{
  BatchResultValues *pBVar1;
  char *pcVar2;
  TestCaseResultData *pTVar3;
  pointer puVar4;
  pointer puVar5;
  char *pcVar6;
  ParseResult PVar7;
  deUint8 *bytes;
  string *tagName;
  long lVar8;
  long lVar9;
  Value VVar10;
  CaseValues tagResult;
  TestCaseResult fullResult;
  undefined1 local_f0 [40];
  _Alloc_hider local_c8;
  char *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  vector<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_> local_a8;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  undefined8 local_70;
  string local_68;
  List local_48;
  
  pBVar1 = this->m_result;
  local_f0._0_8_ = local_f0 + 0x10;
  local_f0._8_8_ = 0;
  local_f0[0x10] = '\0';
  local_c8._M_p = (pointer)&local_b8;
  local_c0 = (char *)0x0;
  local_b8._M_local_buf[0] = '\0';
  local_a8.super__Vector_base<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = (caseData->m_ptr->m_casePath)._M_dataplus._M_p;
  strlen(pcVar2);
  std::__cxx11::string::_M_replace((ulong)local_f0,0,(char *)0x0,(ulong)pcVar2);
  pcVar6 = local_c0;
  local_f0._32_4_ = TESTCASETYPE_SELF_VALIDATE;
  local_f0._36_4_ = caseData->m_ptr->m_statusCode;
  pcVar2 = (caseData->m_ptr->m_statusDetails)._M_dataplus._M_p;
  strlen(pcVar2);
  std::__cxx11::string::_M_replace((ulong)&local_c8,0,pcVar6,(ulong)pcVar2);
  std::vector<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_>::resize
            (&local_a8,
             (long)(pBVar1->m_tagNames).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pBVar1->m_tagNames).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  pTVar3 = caseData->m_ptr;
  if ((*(int *)&(pTVar3->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
       *(int *)&(pTVar3->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start < 1) ||
     (pTVar3->m_statusCode != TESTSTATUSCODE_LAST)) goto LAB_0010c626;
  local_90 = &local_80;
  local_88 = 0;
  local_80 = 0;
  local_70 = 0xe00000004;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  xe::ri::List::List(&local_48);
  xe::TestResultParser::init(&this->m_testResultParser,(EVP_PKEY_CTX *)&local_90);
  puVar4 = (caseData->m_ptr->m_data).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (caseData->m_ptr->m_data).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bytes = (deUint8 *)0x0;
  if (puVar4 != puVar5) {
    bytes = puVar4;
  }
  PVar7 = xe::TestResultParser::parse(&this->m_testResultParser,bytes,(int)puVar5 - (int)puVar4);
  if (PVar7 == PARSERESULT_ERROR || local_70._4_4_ == TESTSTATUSCODE_LAST) {
    tagName = (string *)
              CONCAT71((int7)((ulong)bytes >> 8),
                       local_f0._36_4_ == TESTSTATUSCODE_LAST &&
                       local_70._4_4_ != TESTSTATUSCODE_LAST);
    if (local_f0._36_4_ == TESTSTATUSCODE_LAST && local_70._4_4_ != TESTSTATUSCODE_LAST)
    goto LAB_0010c578;
    if (local_f0._36_4_ == TESTSTATUSCODE_LAST) {
      local_f0._36_4_ = TESTSTATUSCODE_INTERNAL_ERROR;
      tagName = (string *)0x0;
      std::__cxx11::string::_M_replace((ulong)&local_c8,0,local_c0,0x1150f4);
    }
  }
  else {
LAB_0010c578:
    tagName = &local_68;
    local_f0._36_4_ = local_70._4_4_;
    std::__cxx11::string::_M_assign((string *)&local_c8);
  }
  if ((PVar7 != PARSERESULT_ERROR) &&
     (0 < (int)((ulong)((long)(pBVar1->m_tagNames).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pBVar1->m_tagNames).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5))) {
    lVar9 = 8;
    lVar8 = 0;
    do {
      VVar10 = findValueByTag(&local_48,tagName);
      *(Type *)((long)local_a8.
                      super__Vector_base<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar9 + -8) = VVar10.m_type;
      ((anon_union_8_2_07d0b834_for_m_value *)
      ((long)&(local_a8.
               super__Vector_base<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_>.
               _M_impl.super__Vector_impl_data._M_start)->m_type + lVar9))->int64 =
           (deInt64)VVar10.m_value;
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0x10;
    } while (lVar8 < (int)((ulong)((long)(pBVar1->m_tagNames).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pBVar1->m_tagNames).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 5));
  }
  xe::ri::List::~List(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
LAB_0010c626:
  BatchResultValues::add(this->m_result,(CaseValues *)local_f0);
  if (local_a8.super__Vector_base<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,
                    CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
    operator_delete((void *)local_f0._0_8_,CONCAT71(local_f0._17_7_,local_f0[0x10]) + 1);
  }
  return;
}

Assistant:

void testCaseResultComplete (const xe::TestCaseResultPtr& caseData)
	{
		const vector<string>&	tagNames	= m_result.getTagNames();
		CaseValues				tagResult;

		tagResult.casePath		= caseData->getTestCasePath();
		tagResult.caseType		= xe::TESTCASETYPE_SELF_VALIDATE;
		tagResult.statusCode	= caseData->getStatusCode();
		tagResult.statusDetails	= caseData->getStatusDetails();
		tagResult.values.resize(tagNames.size());

		if (caseData->getDataSize() > 0 && caseData->getStatusCode() == xe::TESTSTATUSCODE_LAST)
		{
			xe::TestCaseResult					fullResult;
			xe::TestResultParser::ParseResult	parseResult;

			m_testResultParser.init(&fullResult);
			parseResult = m_testResultParser.parse(caseData->getData(), caseData->getDataSize());

			if ((parseResult != xe::TestResultParser::PARSERESULT_ERROR && fullResult.statusCode != xe::TESTSTATUSCODE_LAST) ||
				(tagResult.statusCode == xe::TESTSTATUSCODE_LAST && fullResult.statusCode != xe::TESTSTATUSCODE_LAST))
			{
				tagResult.statusCode	= fullResult.statusCode;
				tagResult.statusDetails	= fullResult.statusDetails;
			}
			else if (tagResult.statusCode == xe::TESTSTATUSCODE_LAST)
			{
				DE_ASSERT(parseResult == xe::TestResultParser::PARSERESULT_ERROR);
				tagResult.statusCode	= xe::TESTSTATUSCODE_INTERNAL_ERROR;
				tagResult.statusDetails	= "Test case result parsing failed";
			}

			if (parseResult != xe::TestResultParser::PARSERESULT_ERROR)
			{
				for (int valNdx = 0; valNdx < (int)tagNames.size(); valNdx++)
					tagResult.values[valNdx] = findValueByTag(fullResult.resultItems, tagNames[valNdx]);
			}
		}

		m_result.add(tagResult);
	}